

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object.c
# Opt level: O1

value object_get(object obj,char *key)

{
  accessor_type_id aVar1;
  anon_union_8_4_8a094f32_for_data aVar2;
  value pvVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  accessor_type accessor;
  
  if ((obj == (object)0x0) || (obj->interface == (object_interface)0x0)) {
    return (value)0x0;
  }
  aVar1 = ACCESSOR_TYPE_STATIC;
  if (obj->interface->get == (object_impl_interface_get)0x0) {
    return (value)0x0;
  }
  aVar2.attr = class_attribute(obj->cls,key);
  if ((attribute)aVar2.key == (attribute)0x0) {
    if (obj->accessor == ACCESSOR_TYPE_DYNAMIC) {
      aVar1 = ACCESSOR_TYPE_DYNAMIC;
      aVar2.key = key;
    }
    else {
      aVar1 = ACCESSOR_TYPE_DYNAMIC;
      aVar2 = accessor.data;
      if (obj->accessor == ACCESSOR_TYPE_STATIC) {
        pcVar5 = "Attribute %s in object %s is not defined";
        uVar4 = 0x100;
        pcVar7 = obj->name;
        pcVar6 = key;
        goto LAB_00108845;
      }
    }
  }
  accessor.data = aVar2;
  accessor.id = aVar1;
  pvVar3 = (*obj->interface->get)(obj,obj->impl,&accessor);
  if (pvVar3 != (value)0x0) {
    return pvVar3;
  }
  pcVar5 = "Invalid object %s get of attribute %s";
  uVar4 = 0x115;
  pcVar6 = obj->name;
  pcVar7 = key;
LAB_00108845:
  log_write_impl_va("metacall",uVar4,"object_get",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_object.c"
                    ,3,pcVar5,pcVar6,pcVar7);
  return (value)0x0;
}

Assistant:

value object_get(object obj, const char *key)
{
	if (obj != NULL && obj->interface != NULL && obj->interface->get != NULL)
	{
		struct accessor_type accessor;
		attribute attr = class_attribute(obj->cls, key);

		if (attr == NULL)
		{
			switch (obj->accessor)
			{
				case ACCESSOR_TYPE_STATIC: {
					log_write("metacall", LOG_LEVEL_ERROR, "Attribute %s in object %s is not defined", key, obj->name);
					return NULL;
				}

				case ACCESSOR_TYPE_DYNAMIC: {
					accessor.data.key = key;
				}
			}

			accessor.id = ACCESSOR_TYPE_DYNAMIC;
		}
		else
		{
			accessor.data.attr = attr;
			accessor.id = ACCESSOR_TYPE_STATIC;
		}

		value v = obj->interface->get(obj, obj->impl, &accessor);

		if (v == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid object %s get of attribute %s", obj->name, key);
		}

		return v;
	}

	return NULL;
}